

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O2

vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> * __thiscall
elf_parser::Elf_parser::get_symbols
          (vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>
           *__return_storage_ptr__,Elf_parser *this)

{
  string *__lhs;
  int iVar1;
  pointer psVar2;
  bool bVar3;
  uint8_t *sym_type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_struct_208_9_02e3cb33 *this_00;
  pointer psVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  allocator local_181;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *local_180;
  Elf_parser *local_178;
  pointer local_170;
  uint8_t *local_168;
  uint8_t *local_160;
  uint8_t *local_158;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> secs;
  undefined1 local_120 [48];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  local_180 = __return_storage_ptr__;
  local_178 = this;
  get_sections(&secs,this);
  psVar2 = secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_160 = (uint8_t *)0x0;
  for (psVar5 = secs.
                super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    bVar3 = std::operator==(&psVar5->section_type,"SHT_STRTAB");
    if (bVar3) {
      bVar3 = std::operator==(&psVar5->section_name,".strtab");
      if (bVar3) {
        local_160 = local_178->m_mmap_program + psVar5->section_offset;
        break;
      }
    }
  }
  psVar2 = secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_168 = (uint8_t *)0x0;
  for (psVar5 = secs.
                super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    bVar3 = std::operator==(&psVar5->section_type,"SHT_STRTAB");
    if (bVar3) {
      bVar3 = std::operator==(&psVar5->section_name,".dynstr");
      if (bVar3) {
        local_168 = local_178->m_mmap_program + psVar5->section_offset;
        break;
      }
    }
  }
  (local_180->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_180->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_180->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    if (secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector(&secs);
      return local_180;
    }
    __lhs = &(secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
              ._M_impl.super__Vector_impl_data._M_start)->section_type;
    local_170 = secs.
                super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
    bVar3 = std::operator!=(__lhs,"SHT_SYMTAB");
    if (bVar3) {
      bVar3 = std::operator!=(__lhs,"SHT_DYNSYM");
      if (!bVar3) goto LAB_001126b2;
    }
    else {
LAB_001126b2:
      iVar1 = local_170->section_size;
      this_00 = (anon_struct_208_9_02e3cb33 *)0x18;
      local_158 = local_178->m_mmap_program + local_170->section_offset;
      for (uVar6 = 0; uVar6 < (ulong)(long)iVar1 / 0x18; uVar6 = (ulong)((int)uVar6 + 1)) {
        local_120._0_8_ = local_120 + 0x10;
        local_120._8_8_ = 0;
        local_120[0x10] = '\0';
        local_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_d0._M_p = (pointer)&local_c0;
        local_c8 = 0;
        local_c0._M_local_buf[0] = '\0';
        local_b0._M_p = (pointer)&local_a0;
        local_a8 = 0;
        local_a0._M_local_buf[0] = '\0';
        local_90._M_p = (pointer)&local_80;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        local_70._M_p = (pointer)&local_60;
        local_68 = 0;
        local_60._M_local_buf[0] = '\0';
        lVar7 = uVar6 * 0x18;
        sym_type = local_158 + lVar7 + 4;
        local_120._32_8_ = *(undefined8 *)(local_158 + lVar7 + 8);
        local_120._44_4_ = *(undefined4 *)(local_158 + lVar7 + 0x10);
        local_120._40_4_ = (int)uVar6;
        get_symbol_type_abi_cxx11_((string *)local_50,(Elf_parser *)this_00,sym_type);
        paVar4 = local_50;
        std::__cxx11::string::operator=((string *)&local_f0,(string *)local_50[0]._M_local_buf);
        std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        get_symbol_bind_abi_cxx11_((string *)local_50,(Elf_parser *)paVar4,sym_type);
        puVar8 = (uint *)(local_158 + lVar7);
        paVar4 = local_50;
        std::__cxx11::string::operator=((string *)&local_d0,(string *)local_50[0]._M_local_buf);
        std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        get_symbol_visibility_abi_cxx11_
                  ((string *)local_50,(Elf_parser *)paVar4,(uint8_t *)((long)puVar8 + 5));
        paVar4 = local_50;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)local_50[0]._M_local_buf);
        std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        get_symbol_index_abi_cxx11_
                  ((string *)local_50,(Elf_parser *)paVar4,(uint16_t *)((long)puVar8 + 6));
        std::__cxx11::string::operator=((string *)local_120,(string *)local_50[0]._M_local_buf);
        std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        std::__cxx11::string::_M_assign((string *)&local_70);
        bVar3 = std::operator==(__lhs,"SHT_SYMTAB");
        if (bVar3) {
          std::__cxx11::string::string
                    ((string *)local_50[0]._M_local_buf,(char *)(local_160 + *puVar8),&local_181);
          std::__cxx11::string::operator=((string *)&local_90,(string *)local_50[0]._M_local_buf);
          std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        }
        bVar3 = std::operator==(__lhs,"SHT_DYNSYM");
        if (bVar3) {
          std::__cxx11::string::string
                    ((string *)local_50[0]._M_local_buf,(char *)(local_168 + *puVar8),&local_181);
          std::__cxx11::string::operator=((string *)&local_90,(string *)local_50[0]._M_local_buf);
          std::__cxx11::string::~string((string *)local_50[0]._M_local_buf);
        }
        this_00 = (anon_struct_208_9_02e3cb33 *)local_120;
        std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::push_back
                  (local_180,(anon_struct_208_9_02e3cb33 *)local_120);
        anon_struct_208_9_02e3cb33::~symbol_t((anon_struct_208_9_02e3cb33 *)local_120);
      }
    }
    secs.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>._M_impl.
    super__Vector_impl_data._M_start = local_170 + 1;
  } while( true );
}

Assistant:

std::vector<symbol_t> Elf_parser::get_symbols() {
    std::vector<section_t> secs = get_sections();

    // get headers for offsets
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr*)m_mmap_program;
    //Elf64_Shdr *shdr = (Elf64_Shdr*)(m_mmap_program + ehdr->e_shoff);

    // get strtab
    char *sh_strtab_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".strtab")){
            sh_strtab_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    // get dynstr
    char *sh_dynstr_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".dynstr")){
            sh_dynstr_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    std::vector<symbol_t> symbols;
    for(auto &sec: secs) {
        if((sec.section_type != "SHT_SYMTAB") && (sec.section_type != "SHT_DYNSYM"))
            continue;

        auto total_syms = sec.section_size / sizeof(Elf64_Sym);
        auto syms_data = (Elf64_Sym*)(m_mmap_program + sec.section_offset);

        for (unsigned int i = 0; i < total_syms; ++i) {
            symbol_t symbol;
            symbol.symbol_num       = i;
            symbol.symbol_value     = syms_data[i].st_value;
            symbol.symbol_size      = syms_data[i].st_size;
            symbol.symbol_type      = get_symbol_type(syms_data[i].st_info);
            symbol.symbol_bind      = get_symbol_bind(syms_data[i].st_info);
            symbol.symbol_visibility= get_symbol_visibility(syms_data[i].st_other);
            symbol.symbol_index     = get_symbol_index(syms_data[i].st_shndx);
            symbol.symbol_section   = sec.section_name;
            
            if(sec.section_type == "SHT_SYMTAB")
                symbol.symbol_name = std::string(sh_strtab_p + syms_data[i].st_name);
            
            if(sec.section_type == "SHT_DYNSYM")
                symbol.symbol_name = std::string(sh_dynstr_p + syms_data[i].st_name);
            
            symbols.push_back(symbol);
        }
    }
    return symbols;
}